

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O3

SchemaElementDecl * __thiscall
xercesc_4_0::TraverseSchema::traverseElementDecl
          (TraverseSchema *this,DOMElement *elem,bool topLevel)

{
  short sVar1;
  short sVar2;
  uint uVar3;
  SchemaInfo *pSVar4;
  RefHashTableOf<xercesc_4_0::XSAnnotation,_xercesc_4_0::PtrHasher> *pRVar5;
  MemoryManager *pMVar6;
  ComplexTypeInfo *this_00;
  XercesGroupInfo *this_01;
  bool bVar7;
  bool bVar8;
  unsigned_short elemContext;
  int iVar9;
  XMLCh *pXVar10;
  SchemaElementDecl *elem_00;
  undefined4 extraout_var;
  DOMElement *pDVar11;
  RefHashTableBucketElem<xercesc_4_0::XSAnnotation> *pRVar12;
  undefined4 extraout_var_00;
  short *psVar13;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  DOMNode *node;
  XMLCh *pXVar14;
  XMLCh *str1;
  XMLCh *pXVar15;
  SchemaAttDef *this_02;
  short *psVar16;
  undefined7 in_register_00000011;
  short *psVar17;
  size_t __n;
  long lVar18;
  bool isDuplicate;
  ComplexTypeInfo *typeInfo;
  XMLCh *valueConstraint;
  NamespaceScopeManager nsMgr;
  XSAnnotation *local_90;
  bool local_81;
  DatatypeValidator *local_80;
  ComplexTypeInfo *local_78;
  DOMNode *local_70;
  bool local_61;
  DatatypeValidator *local_60;
  ComplexTypeInfo *local_58;
  undefined4 local_4c;
  XMLCh *local_48;
  NamespaceScopeManager local_40;
  undefined4 extraout_var_01;
  
  pSVar4 = this->fSchemaInfo;
  if (elem == (DOMElement *)0x0) {
    local_40.fScopeAdded = false;
  }
  else {
    local_40.fScopeAdded = retrieveNamespaceMapping(this,elem);
  }
  local_40.fSchemaInfo = pSVar4;
  if ((!topLevel) && (pXVar10 = getElementAttValue(this,elem,L"ref",QName), pXVar10 != (XMLCh *)0x0)
     ) {
    elem_00 = processElementDeclRef(this,elem,pXVar10);
    goto LAB_0032221a;
  }
  pXVar10 = getElementAttValue(this,elem,(XMLCh *)SchemaSymbols::fgATT_NAME,NCName);
  if ((pXVar10 == (XMLCh *)0x0) || (*pXVar10 == L'\0')) {
    reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x11);
  }
  else {
    lVar18 = 2;
    do {
      psVar13 = (short *)((long)pXVar10 + lVar18);
      lVar18 = lVar18 + 2;
    } while (*psVar13 != 0);
    bVar7 = XMLChar1_0::isValidNCName(pXVar10,(lVar18 >> 1) - 1);
    if (bVar7) {
      elemContext = 0x10;
      if (topLevel) {
        iVar9 = (*(this->fSchemaGrammar->super_Grammar).super_XSerializable._vptr_XSerializable[0xb]
                )(this->fSchemaGrammar,(ulong)(uint)this->fTargetNSURI,pXVar10,0,0xfffffffe);
        elem_00 = (SchemaElementDecl *)CONCAT44(extraout_var,iVar9);
        if (elem_00 != (SchemaElementDecl *)0x0) goto LAB_0032221a;
        elemContext = 0xf;
      }
      GeneralAttributeCheck::checkAttributes
                (&this->fAttributeCheck,elem,elemContext,this,topLevel,this->fNonXSAttList);
      pDVar11 = XUtil::getFirstChildElement(&elem->super_DOMNode);
      local_70 = &checkContent(this,elem,pDVar11,true,true)->super_DOMNode;
      local_90 = this->fAnnotation;
      if (local_90 == (XSAnnotation *)0x0) {
        if (this->fScanner->fGenerateSyntheticAnnotations == true) {
          local_90 = generateSyntheticAnnotation(this,elem,this->fNonXSAttList);
          this->fAnnotation = local_90;
        }
        else {
          local_90 = (XSAnnotation *)0x0;
        }
      }
      local_4c = (undefined4)CONCAT71(in_register_00000011,topLevel);
      local_81 = false;
      local_48 = (XMLCh *)0x0;
      elem_00 = createSchemaElementDecl(this,elem,pXVar10,&local_81,&local_48,topLevel);
      node = local_70;
      bVar7 = local_81;
      if (local_81 == false) {
        (*(this->fSchemaGrammar->super_Grammar).super_XSerializable._vptr_XSerializable[0x11])
                  (this->fSchemaGrammar,elem_00,0);
        pXVar14 = local_48;
        if (local_48 != (XMLCh *)0x0) {
          if (elem_00->fDefaultValue != (XMLCh *)0x0) {
            (*((elem_00->super_XMLElementDecl).fMemoryManager)->_vptr_MemoryManager[4])();
          }
          pMVar6 = (elem_00->super_XMLElementDecl).fMemoryManager;
          __n = 0;
          do {
            psVar13 = (short *)((long)pXVar14 + __n);
            __n = __n + 2;
          } while (*psVar13 != 0);
          iVar9 = (*pMVar6->_vptr_MemoryManager[3])(pMVar6,__n);
          memcpy((XMLCh *)CONCAT44(extraout_var_00,iVar9),pXVar14,__n);
          elem_00->fDefaultValue = (XMLCh *)CONCAT44(extraout_var_00,iVar9);
        }
        if (local_90 != (XSAnnotation *)0x0) {
          SchemaGrammar::putAnnotation(this->fSchemaGrammar,elem_00,local_90);
        }
        this_00 = this->fCurrentComplexType;
        if ((this_00 != (ComplexTypeInfo *)0x0) &&
           (elem_00->fEnclosingScope == this_00->fScopeDefined)) {
          ComplexTypeInfo::addElement(this_00,elem_00);
          elem_00->fPSVIScope = SCP_LOCAL;
        }
        this_01 = this->fCurrentGroupInfo;
        if ((this_01 != (XercesGroupInfo *)0x0) && (elem_00->fEnclosingScope == this_01->fScope)) {
          XercesGroupInfo::addElement(this_01,elem_00);
          elem_00->fPSVIScope = SCP_ABSENT;
        }
        local_90 = (XSAnnotation *)0x0;
        node = local_70;
      }
      else if (this->fAnnotation != (XSAnnotation *)0x0) {
        pRVar5 = this->fSchemaGrammar->fAnnotations;
        for (pRVar12 = pRVar5->fBucketList[(ulong)elem_00 % pRVar5->fHashModulus];
            pRVar12 != (RefHashTableBucketElem<xercesc_4_0::XSAnnotation> *)0x0;
            pRVar12 = pRVar12->fNext) {
          if ((SchemaElementDecl *)pRVar12->fKey == elem_00) {
            if (pRVar12->fData != (XSAnnotation *)0x0) {
              XSAnnotation::setNext(pRVar12->fData,local_90);
              goto LAB_003223d3;
            }
            break;
          }
        }
        SchemaGrammar::putAnnotation(this->fSchemaGrammar,elem_00,local_90);
LAB_003223d3:
        local_90 = (XSAnnotation *)0x0;
      }
      local_58 = (ComplexTypeInfo *)0x0;
      local_60 = (DatatypeValidator *)0x0;
      if (node == (DOMNode *)0x0) {
        local_78 = (ComplexTypeInfo *)0x0;
        local_80 = (DatatypeValidator *)0x0;
        bVar8 = false;
      }
      else {
        iVar9 = (*node->_vptr_DOMNode[0x18])(node);
        psVar13 = (short *)CONCAT44(extraout_var_01,iVar9);
        if (psVar13 == &SchemaSymbols::fgELT_COMPLEXTYPE) {
LAB_0032248c:
          iVar9 = (*node->_vptr_DOMNode[0x29])(node,SchemaSymbols::fgATT_NAME);
          if (((short *)CONCAT44(extraout_var_02,iVar9) == (short *)0x0) ||
             (*(short *)CONCAT44(extraout_var_02,iVar9) == 0)) {
            local_58 = checkForComplexTypeInfo(this,(DOMElement *)local_70);
            if (local_58 == (ComplexTypeInfo *)0x0) {
              local_78 = (ComplexTypeInfo *)0x0;
              local_80 = (DatatypeValidator *)0x0;
            }
            else {
              local_80 = local_58->fDatatypeValidator;
              local_78 = local_58;
              local_60 = local_80;
              if ((bVar7 == false) && (local_58->fPreprocessed == true)) {
                pXVar14 = local_58->fTypeName;
                pSVar4 = this->fSchemaInfo;
                iVar9 = XMLString::indexOf(pXVar14,L',');
                SchemaInfo::addRecursingType
                          (pSVar4,(DOMElement *)local_70,pXVar14 + (long)iVar9 + 1);
              }
            }
          }
          else {
            local_78 = (ComplexTypeInfo *)0x0;
            reportSchemaError(this,(DOMElement *)local_70,
                              L"http://apache.org/xml/messages/XMLErrors",0x14,pXVar10,(XMLCh *)0x0,
                              (XMLCh *)0x0,(XMLCh *)0x0);
            local_80 = (DatatypeValidator *)0x0;
          }
          node = &XUtil::getNextSiblingElement(local_70)->super_DOMNode;
          bVar8 = true;
        }
        else {
          psVar16 = &SchemaSymbols::fgELT_COMPLEXTYPE;
          psVar17 = psVar13;
          if (psVar13 == (short *)0x0) {
LAB_00322448:
            if (*psVar16 == 0) goto LAB_0032248c;
          }
          else {
            do {
              sVar1 = *psVar17;
              if (sVar1 == 0) goto LAB_00322448;
              sVar2 = *psVar16;
              psVar16 = psVar16 + 1;
              psVar17 = psVar17 + 1;
            } while (sVar1 == sVar2);
          }
          if (psVar13 == &SchemaSymbols::fgELT_SIMPLETYPE) {
LAB_00322585:
            iVar9 = (*node->_vptr_DOMNode[0x29])(node,SchemaSymbols::fgATT_NAME);
            if (((short *)CONCAT44(extraout_var_03,iVar9) == (short *)0x0) ||
               (*(short *)CONCAT44(extraout_var_03,iVar9) == 0)) {
              local_80 = checkForSimpleTypeValidator(this,(DOMElement *)node,0);
              local_60 = local_80;
            }
            else {
              local_80 = (DatatypeValidator *)0x0;
              reportSchemaError(this,(DOMElement *)node,L"http://apache.org/xml/messages/XMLErrors",
                                0x15,pXVar10,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
            }
            node = &XUtil::getNextSiblingElement(node)->super_DOMNode;
            bVar8 = true;
            local_78 = (ComplexTypeInfo *)0x0;
          }
          else {
            psVar16 = &SchemaSymbols::fgELT_SIMPLETYPE;
            if (psVar13 == (short *)0x0) {
LAB_00322566:
              if (*psVar16 == 0) goto LAB_00322585;
            }
            else {
              do {
                sVar1 = *psVar13;
                if (sVar1 == 0) goto LAB_00322566;
                psVar13 = psVar13 + 1;
                sVar2 = *psVar16;
                psVar16 = psVar16 + 1;
              } while (sVar1 == sVar2);
            }
            local_78 = (ComplexTypeInfo *)0x0;
            local_80 = (DatatypeValidator *)0x0;
            bVar8 = false;
          }
        }
        if ((node != (DOMNode *)0x0) &&
           (pDVar11 = checkIdentityConstraintContent(this,(DOMElement *)node),
           pDVar11 != (DOMElement *)0x0)) {
          reportSchemaError(this,pDVar11,L"http://apache.org/xml/messages/XMLErrors",0x16);
        }
      }
      pXVar14 = getElementAttValue(this,elem,(XMLCh *)SchemaSymbols::fgATT_TYPE,QName);
      if (pXVar14 != (XMLCh *)0x0) {
        if (bVar8) {
          reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x36,pXVar10,
                            (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
        }
        else if (*pXVar14 != L'\0') {
          str1 = getLocalPart(this,pXVar14);
          pXVar15 = getPrefix(this,pXVar14);
          pXVar15 = resolvePrefixToURI(this,elem,pXVar15);
          bVar8 = XMLString::equals(pXVar15,L"http://www.w3.org/2001/XMLSchema");
          if ((!bVar8) || (bVar8 = XMLString::equals(str1,L"anyType"), !bVar8)) {
            checkEnumerationRequiredNotation(this,elem,pXVar10,pXVar14);
            local_70 = (DOMNode *)checkTypeFromAnotherSchema(this,elem,pXVar14);
            local_78 = getElementComplexTypeInfo(this,elem,pXVar14,(XMLCh *)local_70);
            local_58 = local_78;
            if (local_78 == (ComplexTypeInfo *)0x0) {
              local_80 = getElementTypeValidator(this,elem,pXVar14,&local_61,(XMLCh *)local_70);
              local_60 = local_80;
            }
            else {
              local_80 = local_78->fDatatypeValidator;
              local_60 = local_80;
            }
          }
        }
      }
      if (bVar7 == false) {
        elem_00->fDatatypeValidator = local_80;
        elem_00->fComplexTypeInfo = local_78;
        iVar9 = 5;
        if (local_80 == (DatatypeValidator *)0x0) {
          if (local_78 != (ComplexTypeInfo *)0x0) {
            iVar9 = local_78->fContentType;
            goto LAB_003227df;
          }
        }
        else {
LAB_003227df:
          *(int *)&(elem_00->super_XMLElementDecl).field_0x2c = iVar9;
        }
        if ((((char)local_4c != '\0') &&
            (pXVar10 = getElementAttValue(this,elem,(XMLCh *)SchemaSymbols::fgATT_SUBSTITUTIONGROUP,
                                          QName), pXVar10 != (XMLCh *)0x0)) && (*pXVar10 != L'\0'))
        {
          processSubstitutionGroup(this,elem,elem_00,&local_58,&local_60,pXVar10);
        }
        pDVar11 = XUtil::getFirstChildElementNS
                            (&elem->super_DOMNode,(XMLCh **)fgIdentityConstraints,
                             L"http://www.w3.org/2001/XMLSchema",3);
        if (pDVar11 != (DOMElement *)0x0) {
          processElemDeclIC(this,pDVar11,elem_00);
        }
      }
      else if ((elem_00->fComplexTypeInfo != local_78) || (elem_00->fDatatypeValidator != local_80))
      {
        reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x43,pXVar10,
                          (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
      }
      if (local_58 == (ComplexTypeInfo *)0x0 && local_60 == (DatatypeValidator *)0x0) {
        if (bVar7 == false) {
          *(undefined4 *)&(elem_00->super_XMLElementDecl).field_0x2c = 1;
          this_02 = (SchemaAttDef *)XMemory::operator_new(0x68,this->fGrammarPoolMemoryManager);
          SchemaAttDef::SchemaAttDef
                    (this_02,L"",L"",this->fEmptyNamespaceURI,Any_Any,ProcessContents_Lax,
                     this->fGrammarPoolMemoryManager);
          if (elem_00->fAttWildCard != (SchemaAttDef *)0x0) {
            (*(elem_00->fAttWildCard->super_XMLAttDef).super_XSerializable._vptr_XSerializable[1])()
            ;
          }
          elem_00->fAttWildCard = this_02;
        }
      }
      else if ((local_48 != (XMLCh *)0x0) &&
              (bVar8 = checkElemDeclValueConstraint(this,elem,elem_00,local_48,local_58,local_60),
              !bVar8 && bVar7 == false)) {
        uVar3 = elem_00->fMiscFlags;
        if (elem_00->fDefaultValue != (XMLCh *)0x0) {
          (*((elem_00->super_XMLElementDecl).fMemoryManager)->_vptr_MemoryManager[4])();
        }
        elem_00->fDefaultValue = (XMLCh *)0x0;
        elem_00->fMiscFlags = uVar3 & 0xfffffffb;
      }
      if (local_90 != (XSAnnotation *)0x0) {
        (*(local_90->super_XSerializable)._vptr_XSerializable[1])();
      }
      goto LAB_0032221a;
    }
    reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x35,L"element",pXVar10,
                      (XMLCh *)0x0,(XMLCh *)0x0);
  }
  elem_00 = (SchemaElementDecl *)0x0;
LAB_0032221a:
  NamespaceScopeManager::~NamespaceScopeManager(&local_40);
  return elem_00;
}

Assistant:

SchemaElementDecl*
TraverseSchema::traverseElementDecl(const DOMElement* const elem,
                                    const bool topLevel)
{
    NamespaceScopeManager nsMgr(elem, fSchemaInfo, this);

    // if local element and ref attribute exists
    if (!topLevel)
    {
        const XMLCh* refName = getElementAttValue(elem, SchemaSymbols::fgATT_REF, DatatypeValidator::QName);
        if (refName)
            return processElementDeclRef(elem, refName);
    }

    // check for empty name
    const XMLCh* name = getElementAttValue(elem, SchemaSymbols::fgATT_NAME, DatatypeValidator::NCName);
    if (!name || !*name)
    {
        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::NoNameRefElement);
        return 0;
    }

    // make sure that name is a valid NCName
    if (!XMLChar1_0::isValidNCName(name, XMLString::stringLen(name)))
    {
        reportSchemaError(elem, XMLUni::fgXMLErrDomain,
            XMLErrs::InvalidDeclarationName, SchemaSymbols::fgELT_ELEMENT, name);
        return 0;
    }

    // if element already exists, just return --- revisit, it should not happen
    if (topLevel)
    {
        SchemaElementDecl* retDecl = (SchemaElementDecl*) fSchemaGrammar->getElemDecl(fTargetNSURI, name, 0, Grammar::TOP_LEVEL_SCOPE);
        if (retDecl)
            return retDecl;
    }

    // Check attributes
    unsigned short scope = (topLevel) ? GeneralAttributeCheck::E_ElementGlobal
                                      : GeneralAttributeCheck::E_ElementLocal;

    fAttributeCheck.checkAttributes(elem, scope, this, topLevel, fNonXSAttList);

    // check annotation
    const DOMElement* content = checkContent(elem, XUtil::getFirstChildElement(elem), true);
    // Put annotations on all elements for the situation where there is a group of
    // elements and not all have annotations.
    //if (fScanner->getGenerateSyntheticAnnotations() && !fAnnotation && fNonXSAttList->size())
    if (!fAnnotation && fScanner->getGenerateSyntheticAnnotations())
    {
        fAnnotation = generateSyntheticAnnotation(elem, fNonXSAttList);
    }
    Janitor<XSAnnotation> janAnnot(fAnnotation);

    // Create element decl
    bool isDuplicate = false;
    const XMLCh* valueConstraint = 0;
    SchemaElementDecl* elemDecl =
        createSchemaElementDecl(elem, name, isDuplicate, valueConstraint, topLevel);

    if (!isDuplicate) {

        fSchemaGrammar->putElemDecl(elemDecl);

        if (valueConstraint)
            elemDecl->setDefaultValue(valueConstraint);

        if (!janAnnot.isDataNull())
            fSchemaGrammar->putAnnotation(elemDecl, janAnnot.release());

        if (fCurrentComplexType &&
            elemDecl->getEnclosingScope() == fCurrentComplexType->getScopeDefined()) {
            fCurrentComplexType->addElement(elemDecl);
            elemDecl->setPSVIScope(PSVIDefs::SCP_LOCAL);
        }

        if (fCurrentGroupInfo &&
            elemDecl->getEnclosingScope() == fCurrentGroupInfo->getScope()) {
            fCurrentGroupInfo->addElement(elemDecl);
            elemDecl->setPSVIScope(PSVIDefs::SCP_ABSENT);
        }
    }
    else {
        if (fAnnotation) {
            XSAnnotation* xsAnnot = fSchemaGrammar->getAnnotation(elemDecl);
            if (!xsAnnot) {
                fSchemaGrammar->putAnnotation(elemDecl, janAnnot.release());
            }
            else {
                xsAnnot->setNext(janAnnot.release());
            }
        }
    }

    // Process children
    bool               anonymousType = false;
    ComplexTypeInfo*   typeInfo = 0;
    DatatypeValidator* validator = 0;

    if (content != 0)
    {
        const XMLCh* contentName = content->getLocalName();

        if (XMLString::equals(contentName, SchemaSymbols::fgELT_COMPLEXTYPE))
        {
            const XMLCh* temp = content->getAttribute(SchemaSymbols::fgATT_NAME);

            if (temp && *temp)
            {
                // REVISIT - we are bypassing the complex type declaration.
                reportSchemaError(content, XMLUni::fgXMLErrDomain, XMLErrs::AnonComplexTypeWithName, name);
            }
            else
            {
                typeInfo = checkForComplexTypeInfo(content);

                if (typeInfo)
                {
                    validator = typeInfo->getDatatypeValidator();

                    if (!isDuplicate) {

                        //Recursing element
                        if (typeInfo->getPreprocessed()) {

                            const XMLCh* typeInfoName = typeInfo->getTypeName();
                            fSchemaInfo->addRecursingType(content, typeInfoName + XMLString::indexOf(typeInfoName, chComma) + 1);
                        }
                    }
                }
            }

            anonymousType = true;
            content = XUtil::getNextSiblingElement(content);
        }
        else if (XMLString::equals(contentName, SchemaSymbols::fgELT_SIMPLETYPE))
        {
            const XMLCh* temp = content->getAttribute(SchemaSymbols::fgATT_NAME);
            if (temp && *temp)
                // REVISIT - we are bypassing the simple type declaration.
                reportSchemaError(content, XMLUni::fgXMLErrDomain, XMLErrs::AnonSimpleTypeWithName, name);
            else
                validator = checkForSimpleTypeValidator(content);

            anonymousType = true;
            content = XUtil::getNextSiblingElement(content);
        }

        // Check for identity constraints
        if (content != 0)
        {
            content = checkIdentityConstraintContent(content);
            if (content != 0)
                reportSchemaError(content, XMLUni::fgXMLErrDomain, XMLErrs::InvalidElementContent);
        }
    }

    // Handle 'type' attribute
    const XMLCh* typeStr = getElementAttValue(elem, SchemaSymbols::fgATT_TYPE, DatatypeValidator::QName);
    if (typeStr)
    {
        if (anonymousType)
        {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::ElementWithTypeAndAnonType, name);
        }
        else if (*typeStr)
        {
            const XMLCh* typeLocalPart = getLocalPart(typeStr);
            const XMLCh* typePrefix = getPrefix(typeStr);
            const XMLCh* typeURI = resolvePrefixToURI(elem, typePrefix);

            if (!XMLString::equals(typeURI, SchemaSymbols::fgURI_SCHEMAFORSCHEMA)
                || !XMLString::equals(typeLocalPart, SchemaSymbols::fgATTVAL_ANYTYPE))
            {
                checkEnumerationRequiredNotation(elem, name, typeStr);

                bool noErrorFound = true;
                const XMLCh* anotherSchemaURI = checkTypeFromAnotherSchema(elem, typeStr);

                // get complex type info
                typeInfo = getElementComplexTypeInfo(elem, typeStr, anotherSchemaURI);

                // get simple type validtor - if not a complex type
                if (typeInfo)
                    validator = typeInfo->getDatatypeValidator();
                else
                    validator = getElementTypeValidator(elem, typeStr, noErrorFound, anotherSchemaURI);
            }
        }
    }

    // check for duplicate elements with different types.
    if (isDuplicate)
    {
        DatatypeValidator* eltDV = elemDecl->getDatatypeValidator();
        ComplexTypeInfo*   eltTypeInfo = elemDecl->getComplexTypeInfo();

        if ( (eltTypeInfo != typeInfo) || (eltDV != validator))  {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::DuplicateElementDeclaration, name);
        }
    }
    // Set element declararion type information
    else
    {
        elemDecl->setDatatypeValidator(validator);
        elemDecl->setComplexTypeInfo(typeInfo);

        if (validator)
            elemDecl->setModelType(SchemaElementDecl::Simple);
        else if (typeInfo)
            elemDecl->setModelType((SchemaElementDecl::ModelTypes)typeInfo->getContentType());

        if (topLevel) {

            // Handle the substitutionGroup
            const XMLCh* subsGroupName = getElementAttValue(elem, SchemaSymbols::fgATT_SUBSTITUTIONGROUP, DatatypeValidator::QName);
            if (subsGroupName && *subsGroupName)
                 processSubstitutionGroup(elem, elemDecl, typeInfo, validator, subsGroupName);
        }

        // process identity constraints
        DOMElement* ic = XUtil::getFirstChildElementNS(
            elem, fgIdentityConstraints, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, 3);

        if (ic)
            processElemDeclIC(ic, elemDecl);
    }

    if (!typeInfo && !validator)
    {
        if (!isDuplicate)
        {
            elemDecl->setModelType(SchemaElementDecl::Any);
            elemDecl->setAttWildCard(
                new (fGrammarPoolMemoryManager) SchemaAttDef(
                    XMLUni::fgZeroLenString, XMLUni::fgZeroLenString,
                    fEmptyNamespaceURI, XMLAttDef::Any_Any,
                    XMLAttDef::ProcessContents_Lax, fGrammarPoolMemoryManager
                )
            );
        }
    }
    else if (valueConstraint)
    {
        if (!checkElemDeclValueConstraint(elem, elemDecl, valueConstraint, typeInfo, validator)
            && !isDuplicate)
        {
            int miscFlags = elemDecl->getMiscFlags();
            miscFlags &= ~ SchemaSymbols::XSD_FIXED;
            elemDecl->setDefaultValue(0);
            elemDecl->setMiscFlags(miscFlags);
        }
    }

    return elemDecl;
}